

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run1L1Q1P.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  time_t tVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference other;
  void *this_00;
  AngleAxis<double> *pAVar5;
  double dVar6;
  __type _Var7;
  RealScalar RVar8;
  double extraout_XMM0_Qa;
  Scalar_conflict extraout_XMM0_Qa_00;
  RealScalar RVar9;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
  local_938;
  Type local_920;
  TransposeReturnType local_8e8;
  Type local_8b0;
  Product<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_0>
  local_878;
  Type local_808;
  Type local_7d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>
  local_798;
  Type local_720;
  Type local_6e8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>
  local_6b0;
  int local_634;
  undefined1 local_630 [4];
  int iiter;
  AngleAxis<double> axAng;
  double rotError;
  double transError;
  Matrix<double,_3,_3,_0,_3,_3> R;
  Matrix<double,_4,_4,_0,_4,_4> estT;
  duration<long,_std::ratio<1L,_1000000L>_> local_530;
  rep local_528;
  rep duration;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_518;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_500;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_4e8;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_4d0;
  undefined1 local_4b8 [8];
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  estTrans;
  Matrix<double,_4,_4,_0,_4,_4> local_498;
  pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_418;
  Matrix<double,_4,_4,_0,_4,_4> local_3d8;
  pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_358;
  Matrix<double,_4,_4,_0,_4,_4> local_318;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_298;
  Matrix<double,_4,_4,_0,_4,_4> local_218;
  int local_18c;
  undefined1 local_188 [4];
  int iter;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lCPairs;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  plPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ptPairs;
  Matrix<double,_4,_4,_0,_4,_4> transGT;
  undefined1 local_a0 [8];
  vector<double,_std::allocator<double>_> rotErrors;
  vector<double,_std::allocator<double>_> transErrors;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numSols;
  undefined1 local_40 [4];
  int powIter;
  vector<double,_std::allocator<double>_> timeVector;
  time_t t;
  time_point t2;
  time_point t1;
  bool verbose;
  
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&t2);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&t);
  tVar1 = time((time_t *)
               &timeVector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  srand((uint)tVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &transErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &rotErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)
             &ptPairs.
              super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector((vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *)&plPairs.
               super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector((vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            *)&lPairs.
               super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector((vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            *)&lCPairs.
               super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector((vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
            *)local_188);
  for (local_18c = 0; dVar6 = (double)local_18c, _Var7 = std::pow<int,int>(10,0), dVar6 < _Var7;
      local_18c = local_18c + 1) {
    getGTTransformations<double>(&local_218,false);
    this = &ptPairs.
            super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::operator=
              ((Matrix<double,_4,_4,_0,_4,_4> *)this,&local_218);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix(&local_318,(Matrix<double,_4,_4,_0,_4,_4> *)this);
    genLineIntPair<double>(&local_298,&local_318);
    std::
    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
    ::push_back((vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                 *)&lCPairs.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_298);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              (&local_3d8,
               (Matrix<double,_4,_4,_0,_4,_4> *)
               &ptPairs.
                super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    genPointPair<double>(&local_358,&local_3d8);
    std::
    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::push_back((vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 *)&plPairs.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_358);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              (&local_498,
               (Matrix<double,_4,_4,_0,_4,_4> *)
               &ptPairs.
                super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    genPlanePair<double>(&local_418,&local_498);
    std::
    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::push_back((vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 *)&lPairs.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_418);
    poVar2 = std::operator<<((ostream *)&std::cout,"GT transformation: ");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                               &ptPairs.
                                super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    estTrans.
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::chrono::_V2::system_clock::now();
    t2.__d.__r = (duration)
                 (duration)
                 estTrans.
                 super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::vector(&local_4d0,
             (vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              *)&plPairs.
                 super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::vector(&local_4e8,
             (vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              *)&lPairs.
                 super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
    ::vector(&local_500,
             (vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              *)&lCPairs.
                 super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
    ::vector(&local_518,
             (vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
              *)local_188);
    solver1L1Q1P<double>
              ((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                *)local_4b8,&local_4d0,&local_4e8,&local_500,&local_518);
    std::
    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
    ::~vector(&local_518);
    std::
    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
    ::~vector(&local_500);
    std::
    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::~vector(&local_4e8);
    std::
    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
    ::~vector(&local_4d0);
    duration = std::chrono::_V2::system_clock::now();
    t = duration;
    estT.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
         (double)std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&t,&t2);
    local_530.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                         (estT.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xf));
    local_528 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_530);
    Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
              ((Matrix<double,_4,_4,_0,_4,_4> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)&transError);
    rotError = 1000.0;
    axAng.m_angle = 1000.0;
    Eigen::AngleAxis<double>::AngleAxis((AngleAxis<double> *)local_630);
    for (local_634 = 0; uVar3 = (ulong)local_634,
        sVar4 = std::
                vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                ::size((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        *)local_4b8), uVar3 < sVar4; local_634 = local_634 + 1) {
      other = std::
              vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              ::operator[]((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                            *)local_4b8,(long)local_634);
      Eigen::Matrix<double,_4,_4,_0,_4,_4>::operator=
                ((Matrix<double,_4,_4,_0,_4,_4> *)
                 (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8),other);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
                (&local_6e8,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8),3,1);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
                (&local_720,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 &ptPairs.
                  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,3,1);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>>::operator-
                (&local_6b0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>> *)&local_6e8
                 ,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                  &local_720);
      RVar8 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>_>
              ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                      *)&local_6b0);
      if (RVar8 < rotError) {
        Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
                  (&local_7d0,
                   (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                   (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + 8),3,1);
        Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topRightCorner<int,int>
                  (&local_808,
                   (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                   &ptPairs.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,3,1);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>>::operator-
                  (&local_798,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>> *)
                   &local_7d0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *
                   )&local_808);
        rotError = Eigen::
                   MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>_>
                   ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                           *)&local_798);
      }
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_8b0,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8),3,3);
      Eigen::DenseBase<Eigen::Matrix<double,4,4,0,4,4>>::topLeftCorner<int,int>
                (&local_920,
                 (DenseBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 &ptPairs.
                  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,3,3);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>_>::
      transpose(&local_8e8,
                (DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_> *)
                &local_920);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>>::operator*
                (&local_878,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>> *)&local_8b0
                 ,(MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                   *)&local_8e8);
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)&transError,
                 (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_0>_>
                  *)&local_878);
      Eigen::AngleAxis<double>::fromRotationMatrix<Eigen::Matrix<double,3,3,0,3,3>>
                ((AngleAxis<double> *)local_630,
                 (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&transError);
      pAVar5 = (AngleAxis<double> *)local_630;
      Eigen::AngleAxis<double>::angle(pAVar5);
      std::abs((int)pAVar5);
      if (extraout_XMM0_Qa < axAng.m_angle) {
        pAVar5 = (AngleAxis<double> *)local_630;
        Eigen::AngleAxis<double>::angle(pAVar5);
        std::abs((int)pAVar5);
        axAng.m_angle = extraout_XMM0_Qa_00;
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"Estimated Transformation:");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                        (R.
                                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                         .m_storage.m_data.array + 8));
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cout,"Error (frob norm): ");
      Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator-
                (&local_938,
                 (MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)
                 &ptPairs.
                  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                 (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array + 8));
      RVar9 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
              ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                      *)&local_938);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar9);
      poVar2 = std::operator<<(poVar2,", time: ");
      this_00 = (void *)std::ostream::operator<<(poVar2,local_528);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    std::
    vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    ::~vector((vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
               *)local_4b8);
  }
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::~vector((vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             *)local_188);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::~vector((vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
             *)&lCPairs.
                super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~vector((vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             *)&lPairs.
                super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::~vector((vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             *)&plPairs.
                super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &rotErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &transErrors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return 0;
}

Assistant:

int main(){
    bool verbose = true;
    high_resolution_clock::time_point t1, t2;

    // Intializes random number generator
    time_t t;
    srand((unsigned) time(&t));
    vector<double> timeVector;

    int powIter = 0;
	
    if (powIter > 1 && verbose)
	{
		std::cerr << "ERR: check the number of iterations and the verbose option..." << std::endl;
		return 0;
	}

    vector<unsigned int> numSols;
    vector<double> transErrors;
    vector<double> rotErrors;
    Matrix<double, 4,4> transGT;
    std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> ptPairs;
	std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> plPairs;
	std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lPairs;
    std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lCPairs;
    for (int iter = 0 ; iter < pow(10,powIter) ; iter++){ 
	    transGT = getGTTransformations<double>();

        lPairs.push_back(genLineIntPair<double>(transGT));
        ptPairs.push_back(genPointPair<double>(transGT));
        plPairs.push_back(genPlanePair<double>(transGT));

        if(verbose){
            cout << "GT transformation: " << endl;
            cout << transGT << endl;
        }

        // test solver
	    t1 = high_resolution_clock::now();
	    // run solver
        vector<Matrix<double, 4,4>> estTrans = solver1L1Q1P<double>(ptPairs,plPairs,lPairs,lCPairs);
	    t2 = high_resolution_clock::now();
	    auto duration = duration_cast<microseconds>( t2 - t1 ).count();

        Matrix<double, 4,4> estT;
        Matrix<double, 3,3> R;
        double transError = 1000;
        double rotError = 1000;
        AngleAxis<double> axAng;
        for(int iiter= 0; iiter < estTrans.size(); iiter++){
                estT = estTrans[iiter];
                if( (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm() < transError)
                    transError = (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm();
                R = estT.topLeftCorner(3,3)*transGT.topLeftCorner(3,3).transpose();
                axAng.fromRotationMatrix(R);
                if( abs(axAng.angle()) < rotError)
                    rotError = abs(axAng.angle());
                if (verbose) cout << "Estimated Transformation:" << endl << estT << endl;
	            if (verbose) cout << "Error (frob norm): " << (transGT-estT).norm() << ", time: " << duration << endl;        
        }         

    }

    return 0;
}